

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

uint64_t lj_carith_powu64(uint64_t x,uint64_t k)

{
  undefined8 local_28;
  uint64_t y;
  uint64_t k_local;
  uint64_t x_local;
  
  y = k;
  k_local = x;
  if (k == 0) {
    x_local = 1;
  }
  else {
    for (; (y & 1) == 0; y = y >> 1) {
      k_local = k_local * k_local;
    }
    local_28 = k_local;
    y = y >> 1;
    if (y != 0) {
      for (; k_local = k_local * k_local, y != 1; y = y >> 1) {
        if ((y & 1) != 0) {
          local_28 = k_local * local_28;
        }
      }
      local_28 = k_local * local_28;
    }
    x_local = local_28;
  }
  return x_local;
}

Assistant:

uint64_t lj_carith_powu64(uint64_t x, uint64_t k)
{
  uint64_t y;
  if (k == 0)
    return 1;
  for (; (k & 1) == 0; k >>= 1) x *= x;
  y = x;
  if ((k >>= 1) != 0) {
    for (;;) {
      x *= x;
      if (k == 1) break;
      if (k & 1) y *= x;
      k >>= 1;
    }
    y *= x;
  }
  return y;
}